

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::BuildVectorOfTableFromBytes
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  Value *pVVar1;
  size_t t;
  size_t t_00;
  string field_method;
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [32];
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"nested_flatbuffer",(allocator<char> *)&local_a8);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (pVVar1 != (Value *)0x0) {
    (*(this->namer_).super_Namer._vptr_Namer[4])(&local_c8,&this->namer_,field);
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_a8,&this->namer_,struct_def);
    std::operator+(&local_108,"def ",&local_a8);
    std::operator+(&bStack_128,&local_108,"Make");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   &bStack_128,&local_c8);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,"builder.StartVector(");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)local_e8);
    local_e8._0_4_ = (field->value).type.element;
    local_e8._24_2_ = (field->value).type.fixed_length;
    local_e8._4_4_ = BASE_TYPE_NONE;
    local_e8._8_8_ = (field->value).type.struct_def;
    local_e8._16_8_ = (field->value).type.enum_def;
    t = InlineAlignment((Type *)local_e8);
    t_00 = InlineSize((Type *)local_e8);
    NumToString<unsigned_long>(&bStack_128,t_00);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_128);
    NumToString<unsigned_long>(&local_108,t);
    std::operator+(&bStack_128,", len(bytes), ",&local_108);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&bStack_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   "builder.head = builder.head - len(bytes)\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::operator+(&bStack_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   "builder.Bytes[builder.head : builder.head + len(bytes)]");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_128);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&bStack_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,"return builder.EndVector()\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_128);
    if ((((this->super_BaseGenerator).parser_)->opts).one_file == false) {
      std::operator+(&local_108,"def Make",&local_c8);
      std::operator+(&bStack_128,&local_108,"VectorFromBytes(builder, bytes):\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&bStack_128);
      std::__cxx11::string::~string((string *)&local_108);
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(anonymous_namespace)::Indent_abi_cxx11_,"return ");
      std::operator+(&local_68,&local_88,&local_a8);
      std::operator+(&local_48,&local_68,"Make");
      std::operator+(&local_108,&local_48,&local_c8);
      std::operator+(&bStack_128,&local_108,"VectorFromBytes(builder, bytes)\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&bStack_128);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void BuildVectorOfTableFromBytes(const StructDef &struct_def,
                                   const FieldDef &field,
                                   std::string *code_ptr) const {
    auto nested = field.attributes.Lookup("nested_flatbuffer");
    if (!nested) { return; }  // There is no nested flatbuffer.

    auto &code = *code_ptr;
    const std::string field_method = namer_.Method(field);
    const std::string struct_type = namer_.Type(struct_def);

    // Generate method with struct and field name.
    code += "def " + struct_type + "Make" + field_method;
    code += "VectorFromBytes(builder, bytes):\n";
    code += Indent + "builder.StartVector(";
    auto vector_type = field.value.type.VectorType();
    auto alignment = InlineAlignment(vector_type);
    auto elem_size = InlineSize(vector_type);
    code += NumToString(elem_size);
    code += ", len(bytes), " + NumToString(alignment);
    code += ")\n";
    code += Indent + "builder.head = builder.head - len(bytes)\n";
    code += Indent + "builder.Bytes[builder.head : builder.head + len(bytes)]";
    code += " = bytes\n";
    code += Indent + "return builder.EndVector()\n";

    if (!parser_.opts.one_file) {
      // Generate method without struct and field name.
      code += "def Make" + field_method + "VectorFromBytes(builder, bytes):\n";
      code += Indent + "return " + struct_type + "Make" + field_method +
              "VectorFromBytes(builder, bytes)\n";
    }
  }